

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml_reporter.c
# Opt level: O2

void xml_reporter_finish_suite(TestReporter *reporter,char *filename,int line)

{
  undefined8 *puVar1;
  long lVar2;
  
  puVar1 = (undefined8 *)reporter->memo;
  lVar2 = (long)context_stack_p;
  reporter_finish_suite(reporter,filename,line);
  reporter->total_passes = reporter->total_passes + reporter->passes;
  reporter->total_failures = reporter->total_failures + reporter->failures;
  reporter->total_skips = reporter->total_skips + reporter->skips;
  reporter->total_exceptions = reporter->total_exceptions + reporter->exceptions;
  xmlFormatProp((xmlNodePtr)(&child_output_tmpfile)[lVar2 * 5],(xmlChar *)"failures","%d");
  xmlFormatProp((xmlNodePtr)(&child_output_tmpfile)[lVar2 * 5],(xmlChar *)"errors","%d",
                (ulong)(uint)reporter->exceptions);
  xmlFormatProp((xmlNodePtr)(&child_output_tmpfile)[lVar2 * 5],(xmlChar *)"skipped","%d",
                (ulong)(uint)reporter->skips);
  xmlFormatProp((xmlNodePtr)(&child_output_tmpfile)[lVar2 * 5],(xmlChar *)"time","%.5f",
                (double)(uint)(&context_stack_p)[lVar2 * 10] / 1000.0);
  deleteEmpty((xmlNodePtr)(&child_output_tmpfile)[lVar2 * 5]);
  (*(code *)*puVar1)((&output)[lVar2 * 5]);
  xmlFreeDoc((&output)[lVar2 * 5]);
  if (1 < context_stack_p) {
    context_stack[context_stack_p - 2].suite_duration =
         context_stack[context_stack_p - 2].suite_duration + (&context_stack_p)[lVar2 * 10];
  }
  context_stack_p = context_stack_p + -1;
  return;
}

Assistant:

static void xml_reporter_finish_suite(TestReporter *reporter, const char *filename, int line) {
    XmlMemo *memo = (XmlMemo *)reporter->memo;
    struct xml_suite_context *ctx = &context_stack[context_stack_p-1];

    reporter_finish_suite(reporter, filename, line);

    reporter->total_passes += reporter->passes;
    reporter->total_failures += reporter->failures;
    reporter->total_skips += reporter->skips;
    reporter->total_exceptions += reporter->exceptions;

    xmlFormatProp(ctx->suite, XMLSTRING("failures"), "%d", reporter->failures);
    xmlFormatProp(ctx->suite, XMLSTRING("errors"), "%d", reporter->exceptions);
    xmlFormatProp(ctx->suite, XMLSTRING("skipped"), "%d", reporter->skips);
    xmlFormatProp(ctx->suite, XMLSTRING("time"), "%.5f", (double)ctx->suite_duration/(double)1000);

    deleteEmpty(ctx->suite);
    memo->printer(ctx->doc);
    xmlFreeDoc(ctx->doc);
    if (context_stack_p > 1) {
        context_stack[context_stack_p-2].suite_duration += ctx->suite_duration;
    }
    --context_stack_p;
}